

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite.cpp
# Opt level: O2

vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
* __thiscall
Test::Suite::filterTests
          (vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
           *__return_storage_ptr__,Suite *this,
          vector<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_> *selectedMethods)

{
  pointer pTVar1;
  TestMethodInfo *info;
  pointer pTVar2;
  reference_wrapper<const_Test::Suite::TestMethod> local_28;
  
  (__return_storage_ptr__->
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::reference_wrapper<const_Test::Suite::TestMethod>,_std::allocator<std::reference_wrapper<const_Test::Suite::TestMethod>_>_>
  ::reserve(__return_storage_ptr__,
            ((long)(selectedMethods->
                   super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)(selectedMethods->
                  super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
                  _M_impl.super__Vector_impl_data._M_start) / 0x28);
  pTVar1 = (selectedMethods->
           super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar2 = (selectedMethods->
                super__Vector_base<Test::TestMethodInfo,_std::allocator<Test::TestMethodInfo>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    local_28._M_data = (TestMethod *)pTVar2->reference;
    std::
    vector<std::reference_wrapper<Test::Suite::TestMethod_const>,std::allocator<std::reference_wrapper<Test::Suite::TestMethod_const>>>
    ::emplace_back<std::reference_wrapper<Test::Suite::TestMethod_const>>
              ((vector<std::reference_wrapper<Test::Suite::TestMethod_const>,std::allocator<std::reference_wrapper<Test::Suite::TestMethod_const>>>
                *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::reference_wrapper<const Suite::TestMethod>> Suite::filterTests(
    const std::vector<TestMethodInfo> &selectedMethods) {
  std::vector<std::reference_wrapper<const TestMethod>> result;
  result.reserve(selectedMethods.size());

  for (const auto &info : selectedMethods) {
    const auto *method = reinterpret_cast<const TestMethod *>(info.reference);
    result.emplace_back(std::cref(*method));
  }

  return result;
}